

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encryptor_test.cpp
# Opt level: O3

void run_test<cppcms::sessions::impl::hmac_factory>(string *name,string *k,bool is_signature)

{
  pointer pcVar1;
  undefined1 auVar2 [8];
  undefined8 uVar3;
  string *psVar4;
  _Alloc_hider _Var5;
  char cVar6;
  bool bVar7;
  int iVar8;
  ostream *poVar9;
  runtime_error *prVar10;
  undefined8 in_RCX;
  undefined7 in_register_00000011;
  uint uVar11;
  string *psVar12;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  string a_1;
  string plain;
  string a;
  string cipher;
  ostringstream oss;
  string b_1;
  string b;
  string orig_text [2];
  undefined1 local_300 [8];
  undefined1 local_2f8 [16];
  long local_2e8 [2];
  undefined1 *local_2d8;
  char *local_2d0;
  undefined1 local_2c8 [16];
  string *local_2b8;
  undefined1 *local_2b0 [2];
  undefined1 local_2a0 [16];
  undefined1 *local_290;
  ulong local_288;
  undefined1 local_280 [20];
  undefined4 local_26c;
  undefined1 *local_268;
  size_t local_260;
  undefined1 local_258 [360];
  string *local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  string local_d8;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [24];
  string local_50 [32];
  
  pcVar1 = (k->_M_dataplus)._M_p;
  local_e0 = CONCAT71((int7)((ulong)in_RCX >> 8),*pcVar1);
  local_e8 = CONCAT71((int7)((ulong)pcVar1 >> 8),pcVar1[0x1f]);
  local_2b8 = k;
  cppcms::crypto::key::key((key *)&local_268,(string *)k);
  gen<cppcms::sessions::impl::hmac_factory>((string *)local_300,(key *)name);
  cppcms::crypto::key::~key((key *)&local_268);
  auVar2 = local_300;
  local_268 = local_258;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"Hello World","");
  (*(code *)**(undefined8 **)auVar2)(&local_290,auVar2,&local_268);
  if (local_268 != local_258) {
    operator_delete(local_268);
  }
  local_2d8 = local_2c8;
  local_2d0 = (char *)0x0;
  local_2c8[0] = 0;
  cVar6 = (**(code **)(*(long *)local_300 + 8))(local_300,&local_290,&local_2d8);
  if (cVar6 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_268);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
               ,0x61);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,":",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&local_268,0x25);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," enc->decrypt(cipher,plain)",0x1b);
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar10,(string *)local_98);
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_f0 = name;
  iVar8 = std::__cxx11::string::compare((char *)&local_2d8);
  if (iVar8 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_268);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
               ,0x61);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,":",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&local_268,0x26);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," plain==\"Hello World\"",0x15);
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar10,(string *)local_98);
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_98[0] = local_88;
  psVar12 = (string *)local_98;
  std::__cxx11::string::_M_construct<char_const*>(psVar12,"");
  local_26c = (undefined4)CONCAT71(in_register_00000011,is_signature);
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"x","");
  bVar15 = true;
  do {
    bVar7 = bVar15;
    (*(code *)**(undefined8 **)local_300)((string *)&local_268,local_300,psVar12);
    std::__cxx11::string::operator=((string *)&local_290,(string *)&local_268);
    if (local_268 != local_258) {
      operator_delete(local_268);
    }
    cVar6 = (**(code **)(*(long *)local_300 + 8))(local_300,(string *)&local_290,&local_2d8);
    if (cVar6 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_268);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_268,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                 ,0x61);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,":",1);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)&local_268,0x2b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," enc->decrypt(cipher,plain)",0x1b);
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar10,(string *)local_2b0);
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_2d0 != *(char **)(psVar12 + 8)) {
LAB_0010775a:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_268);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_268,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                 ,0x61);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,":",1);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)&local_268,0x2c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," plain==orig_text[t]",0x14);
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar10,(string *)local_2b0);
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_2d0 != (char *)0x0) {
      iVar8 = bcmp(local_2d8,*(void **)psVar12,(size_t)local_2d0);
      if (iVar8 != 0) goto LAB_0010775a;
    }
    if (local_288 != 0) {
      uVar11 = 1;
      uVar14 = 0;
      do {
        local_290[uVar14] = local_290[uVar14] + -1;
        cVar6 = (**(code **)(*(long *)local_300 + 8))(local_300,(string *)&local_290,&local_2d8);
        if (cVar6 != '\0') {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_268);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,"Error ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_268,
                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                     ,0x61);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,":",1);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&local_268,0x30);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9," !enc->decrypt(cipher,plain)",0x1c);
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar10,(string *)local_2b0);
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_290[uVar14] = local_290[uVar14] + '\x02';
        cVar6 = (**(code **)(*(long *)local_300 + 8))(local_300,(string *)&local_290,&local_2d8);
        if (cVar6 != '\0') {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_268);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,"Error ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_268,
                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                     ,0x61);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,":",1);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&local_268,0x32);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9," !enc->decrypt(cipher,plain)",0x1c);
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar10,(string *)local_2b0);
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_290[uVar14] = local_290[uVar14] + -1;
        uVar14 = (ulong)uVar11;
        uVar11 = uVar11 + 1;
      } while (uVar14 < local_288);
    }
    auVar2 = local_300;
    psVar12 = (string *)local_78;
    bVar15 = false;
  } while (bVar7);
  local_268 = local_258;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"");
  cVar6 = (**(code **)(*(long *)auVar2 + 8))(auVar2,&local_268,&local_2d8);
  psVar4 = local_f0;
  if (local_268 != local_258) {
    operator_delete(local_268);
  }
  if (cVar6 != '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_268);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
               ,0x61);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,":",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&local_268,0x36);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," !enc->decrypt(\"\",plain)",0x18);
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar10,(string *)local_2b0);
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_2b0[0] = local_2a0;
  std::__cxx11::string::_M_construct((ulong)local_2b0,'@');
  cVar6 = (**(code **)(*(long *)local_300 + 8))(local_300,local_2b0,&local_2d8);
  if (cVar6 != '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_268);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
               ,0x61);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,":",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&local_268,0x38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," !enc->decrypt(a,plain)",0x17);
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar10,(string *)local_b8);
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct((ulong)local_b8,'@');
  cVar6 = (**(code **)(*(long *)local_300 + 8))(local_300,local_b8,&local_2d8);
  auVar2 = local_300;
  if (cVar6 != '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_268);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
               ,0x61);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,":",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&local_268,0x3a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," !enc->decrypt(b,plain)",0x17);
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar10,(string *)local_2f8);
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_2f8._0_8_ = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"");
  (*(code *)**(undefined8 **)auVar2)(&local_268,auVar2,local_2f8);
  std::__cxx11::string::operator=((string *)&local_290,(string *)&local_268);
  if (local_268 != local_258) {
    operator_delete(local_268);
  }
  if ((long *)local_2f8._0_8_ != local_2e8) {
    operator_delete((void *)local_2f8._0_8_);
  }
  cVar6 = (**(code **)(*(long *)local_300 + 8))(local_300,&local_290,&local_2d8);
  if (cVar6 != '\0') {
    iVar8 = std::__cxx11::string::compare((char *)&local_2d8);
    auVar2 = local_300;
    if (iVar8 == 0) {
      local_2f8._0_8_ = local_2e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"test","");
      (*(code *)**(undefined8 **)auVar2)(&local_268,auVar2,local_2f8);
      std::__cxx11::string::operator=((string *)&local_290,(string *)&local_268);
      if (local_268 != local_258) {
        operator_delete(local_268);
      }
      if ((long *)local_2f8._0_8_ != local_2e8) {
        operator_delete((void *)local_2f8._0_8_);
      }
      *(local_2b8->_M_dataplus)._M_p = (char)local_e0 + '\x01';
      cppcms::crypto::key::key((key *)&local_268,(string *)local_2b8);
      gen<cppcms::sessions::impl::hmac_factory>((string *)local_2f8,(key *)psVar4);
      uVar3 = local_2f8._0_8_;
      auVar2 = local_300;
      local_2f8._0_8_ = (long *)0x0;
      local_300 = (undefined1  [8])uVar3;
      if (auVar2 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)auVar2 + 0x18))();
        if ((long *)local_2f8._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_2f8._0_8_ + 0x18))();
        }
      }
      local_2f8._0_8_ = (long *)0x0;
      cppcms::crypto::key::~key((key *)&local_268);
      cVar6 = (**(code **)(*(long *)local_300 + 8))(local_300,&local_290,&local_2d8);
      if (cVar6 != '\0') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_268);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_268,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                   ,0x61);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,":",1);
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)&local_268,0x40);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9," !enc->decrypt(cipher,plain)",0x1c);
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar10,(string *)local_2f8);
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      *(local_2b8->_M_dataplus)._M_p = (char)local_e0;
      (local_2b8->_M_dataplus)._M_p[0x1f] = (char)local_e8 + '\x01';
      cppcms::crypto::key::key((key *)&local_268,(string *)local_2b8);
      gen<cppcms::sessions::impl::hmac_factory>((string *)local_2f8,(key *)psVar4);
      uVar3 = local_2f8._0_8_;
      auVar2 = local_300;
      local_2f8._0_8_ = (long *)0x0;
      local_300 = (undefined1  [8])uVar3;
      if (auVar2 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)auVar2 + 0x18))();
        if ((long *)local_2f8._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_2f8._0_8_ + 0x18))();
        }
      }
      local_2f8._0_8_ = (long *)0x0;
      cppcms::crypto::key::~key((key *)&local_268);
      cVar6 = (**(code **)(*(long *)local_300 + 8))(local_300,&local_290,&local_2d8);
      if (cVar6 != '\0') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_268);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_268,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                   ,0x61);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,":",1);
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)&local_268,0x44);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9," !enc->decrypt(cipher,plain)",0x1c);
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar10,(string *)local_2f8);
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      (local_2b8->_M_dataplus)._M_p[0x1f] = (char)local_e8;
      cppcms::crypto::key::key((key *)&local_268,(string *)local_2b8);
      gen<cppcms::sessions::impl::hmac_factory>((string *)local_2f8,(key *)psVar4);
      uVar3 = local_2f8._0_8_;
      auVar2 = local_300;
      local_2f8._0_8_ = (long *)0x0;
      local_300 = (undefined1  [8])uVar3;
      if (auVar2 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)auVar2 + 0x18))();
        if ((long *)local_2f8._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_2f8._0_8_ + 0x18))();
        }
      }
      local_2f8._0_8_ = (long *)0x0;
      cppcms::crypto::key::~key((key *)&local_268);
      cVar6 = (**(code **)(*(long *)local_300 + 8))(local_300,&local_290,&local_2d8);
      if (cVar6 != '\0') {
        iVar8 = std::__cxx11::string::compare((char *)&local_2d8);
        if (iVar8 == 0) {
          if ((char)local_26c != '\0') {
LAB_0010752e:
            if (local_b8[0] != local_a8) {
              operator_delete(local_b8[0]);
            }
            if (local_2b0[0] != local_2a0) {
              operator_delete(local_2b0[0]);
            }
            lVar13 = 0;
            do {
              if (local_68 + lVar13 != *(undefined1 **)((long)local_78 + lVar13)) {
                operator_delete(*(undefined1 **)((long)local_78 + lVar13));
              }
              lVar13 = lVar13 + -0x20;
            } while (lVar13 != -0x40);
            if (local_2d8 != local_2c8) {
              operator_delete(local_2d8);
            }
            if (local_290 != local_280) {
              operator_delete(local_290);
            }
            if (local_300 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_300 + 0x18))();
            }
            return;
          }
          (*(code *)**(undefined8 **)local_300)(&local_268,local_300,&local_2d8);
          (*(code *)**(undefined8 **)local_300)(local_2f8,local_300,&local_2d8);
          uVar3 = local_2f8._0_8_;
          if (local_260 == local_2f8._8_8_) {
            if (local_260 == 0) {
              bVar15 = false;
            }
            else {
              iVar8 = bcmp(local_268,(void *)local_2f8._0_8_,local_260);
              bVar15 = iVar8 != 0;
            }
          }
          else {
            bVar15 = true;
          }
          if ((long *)uVar3 != local_2e8) {
            operator_delete((void *)uVar3);
          }
          if (local_268 != local_258) {
            operator_delete(local_268);
          }
          if (!bVar15) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_268);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,"Error ",6);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_268,
                       "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                       ,0x61);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,":",1);
            poVar9 = (ostream *)std::ostream::operator<<((ostream *)&local_268,0x4a);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9," enc->encrypt(plain)!=enc->encrypt(plain)",0x29);
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar10,(string *)local_2f8);
            __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          cppcms::crypto::key::key((key *)&local_268,(string *)local_2b8);
          psVar4 = local_f0;
          gen<cppcms::sessions::impl::hmac_factory>((string *)local_2f8,(key *)local_f0);
          uVar3 = local_2f8._0_8_;
          auVar2 = local_300;
          local_2f8._0_8_ = (long *)0x0;
          local_300 = (undefined1  [8])uVar3;
          if (auVar2 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)auVar2 + 0x18))();
            if ((long *)local_2f8._0_8_ != (long *)0x0) {
              (**(code **)(*(long *)local_2f8._0_8_ + 0x18))();
            }
          }
          local_2f8._0_8_ = (long *)0x0;
          cppcms::crypto::key::~key((key *)&local_268);
          (*(code *)**(undefined8 **)local_300)(local_2f8,local_300,&local_2d8);
          cppcms::crypto::key::key((key *)&local_268,(string *)local_2b8);
          gen<cppcms::sessions::impl::hmac_factory>(&local_d8,(key *)psVar4);
          _Var5._M_p = local_d8._M_dataplus._M_p;
          auVar2 = local_300;
          local_d8._M_dataplus._M_p = (pointer)0x0;
          local_300 = (undefined1  [8])_Var5._M_p;
          if (auVar2 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)auVar2 + 0x18))();
            if ((long *)local_d8._M_dataplus._M_p != (long *)0x0) {
              (**(code **)(*(long *)local_d8._M_dataplus._M_p + 0x18))();
            }
          }
          local_d8._M_dataplus._M_p = (pointer)0x0;
          cppcms::crypto::key::~key((key *)&local_268);
          (*(code *)**(undefined8 **)local_300)(&local_d8,local_300,&local_2d8);
          if (local_2f8._8_8_ == local_d8._M_string_length) {
            if (local_2f8._8_8_ == 0) {
LAB_001081e8:
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_268);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,"Error ",6);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_268,
                         "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                         ,0x61);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,":",1);
              poVar9 = (ostream *)std::ostream::operator<<((ostream *)&local_268,0x4f);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9," a!=b",5);
              prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::stringbuf::str();
              std::runtime_error::runtime_error(prVar10,local_50);
              __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            iVar8 = bcmp((void *)local_2f8._0_8_,local_d8._M_dataplus._M_p,local_2f8._8_8_);
            if (iVar8 == 0) goto LAB_001081e8;
          }
          std::__cxx11::string::_M_replace((ulong)&local_2d8,0,local_2d0,0x10ba8e);
          cVar6 = (**(code **)(*(long *)local_300 + 8))(local_300,local_2f8,&local_2d8);
          if (cVar6 != '\0') {
            iVar8 = std::__cxx11::string::compare((char *)&local_2d8);
            if (iVar8 == 0) {
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                operator_delete(local_d8._M_dataplus._M_p);
              }
              if ((long *)local_2f8._0_8_ != local_2e8) {
                operator_delete((void *)local_2f8._0_8_);
              }
              goto LAB_0010752e;
            }
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_268);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,"Error ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_268,
                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                     ,0x61);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,":",1);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&local_268,0x51);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9," enc->decrypt(a,plain) && plain == \"test\"",0x29);
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar10,local_50);
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_268);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_268,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                 ,0x61);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,":",1);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)&local_268,0x47);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9," enc->decrypt(cipher,plain) && plain==\"test\"",0x2c);
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar10,(string *)local_2f8);
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_268);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,"Error ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_268,
             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
             ,0x61);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,":",1);
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)&local_268,0x3c);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9," enc->decrypt(cipher,plain) && plain==\"\"",0x28);
  prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar10,(string *)local_2f8);
  __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void run_test(std::string name,std::string k,bool is_signature = false) 
{
	using cppcms::crypto::key;
	char c1=k[0];
	char c2=k[31];
	std::unique_ptr<cppcms::sessions::encryptor> enc = gen<Encryptor>(name,key(k));
	std::string cipher=enc->encrypt("Hello World");
	std::string plain;
	TEST(enc->decrypt(cipher,plain));
	TEST(plain=="Hello World");

	std::string orig_text[2]= { "", "x" };
	for(unsigned t=0;t<2;t++) {
		cipher=enc->encrypt(orig_text[t]);
		TEST(enc->decrypt(cipher,plain));
		TEST(plain==orig_text[t]);

		for(unsigned i=0;i<cipher.size();i++) {
			cipher[i]--;
			TEST(!enc->decrypt(cipher,plain));
			cipher[i]+=2;
			TEST(!enc->decrypt(cipher,plain));
			cipher[i]--;
		}
	}
	TEST(!enc->decrypt("",plain));
	std::string a(64,'\0');
	TEST(!enc->decrypt(a,plain));
	std::string b(64,'\xFF');
	TEST(!enc->decrypt(b,plain));
	cipher=enc->encrypt("");
	TEST(enc->decrypt(cipher,plain) && plain=="");
	cipher=enc->encrypt("test");
	k[0]=c1+1;
	enc = gen<Encryptor>(name,key(k));
	TEST(!enc->decrypt(cipher,plain));
	k[0]=c1;
	k[31]=c2+1;
	enc = gen<Encryptor>(name,key(k));
	TEST(!enc->decrypt(cipher,plain));
	k[31]=c2;
	enc = gen<Encryptor>(name,key(k));
	TEST(enc->decrypt(cipher,plain) && plain=="test");
	// Salt works
	if(!is_signature) {
		TEST(enc->encrypt(plain)!=enc->encrypt(plain));
		enc = gen<Encryptor>(name,key(k));
		std::string a=enc->encrypt(plain);
		enc = gen<Encryptor>(name,key(k));
		std::string b=enc->encrypt(plain);
		TEST(a!=b);
		plain="XX";
		TEST(enc->decrypt(a,plain) && plain == "test");
	}
}